

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::SaveIniSettingsToDisk(char *ini_filename)

{
  ImGuiContext *out_size;
  char *filename;
  FILE *__s;
  long in_RDI;
  FILE *f;
  char *ini_data;
  size_t ini_data_size;
  ImGuiContext *g;
  char *in_stack_ffffffffffffffd8;
  
  out_size = GImGui;
  GImGui->SettingsDirtyTimer = 0.0;
  if (in_RDI != 0) {
    filename = SaveIniSettingsToMemory((size_t *)out_size);
    __s = (FILE *)ImFileOpen(filename,in_stack_ffffffffffffffd8);
    if (__s != (FILE *)0x0) {
      fwrite(filename,1,0,__s);
      fclose(__s);
    }
  }
  return;
}

Assistant:

void ImGui::SaveIniSettingsToDisk(const char* ini_filename)
{
    ImGuiContext& g = *GImGui;
    g.SettingsDirtyTimer = 0.0f;
    if (!ini_filename)
        return;

    size_t ini_data_size = 0;
    const char* ini_data = SaveIniSettingsToMemory(&ini_data_size);
    FILE* f = ImFileOpen(ini_filename, "wt");
    if (!f)
        return;
    fwrite(ini_data, sizeof(char), ini_data_size, f);
    fclose(f);
}